

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

bool __thiscall GraphBuilder::matchForksAndJoins(GraphBuilder *this)

{
  JoinNode *this_00;
  ForkNode *forkNode;
  key_type pIVar1;
  _Hash_node_base *p_Var2;
  undefined8 *puVar3;
  NodeType NVar4;
  iterator iVar5;
  iterator iVar6;
  ExitNode *exitNode;
  key_type pIVar7;
  undefined8 *puVar8;
  ForkJoinAnalysis FJA;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> functions;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> llvmforks;
  bool local_7c;
  key_type local_70;
  key_type local_68;
  long local_60;
  _Hash_node_base *local_58;
  key_type local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  long local_38;
  
  local_58 = (this->llvmToJoins_)._M_h._M_before_begin._M_nxt;
  if (local_58 == (_Hash_node_base *)0x0) {
    local_7c = false;
  }
  else {
    local_7c = false;
    do {
      this_00 = (JoinNode *)local_58[2]._M_nxt;
      dg::ForkJoinAnalysis::matchJoin((Value *)&local_48);
      puVar3 = local_40;
      for (puVar8 = local_48; p_Var2 = local_58, puVar8 != puVar3; puVar8 = puVar8 + 1) {
        local_70 = (key_type)*puVar8;
        iVar5 = std::
                _Hashtable<const_llvm::Instruction_*,_std::pair<const_llvm::Instruction_*const,_Node_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Instruction_*>,_std::hash<const_llvm::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->llvmToNodeMap_)._M_h,&local_70);
        if (((iVar5.
              super__Node_iterator_base<std::pair<const_llvm::Instruction_*const,_Node_*>,_false>.
              _M_cur != (__node_type *)0x0) &&
            (forkNode = *(ForkNode **)
                         ((long)iVar5.
                                super__Node_iterator_base<std::pair<const_llvm::Instruction_*const,_Node_*>,_false>
                                ._M_cur + 0x10), forkNode != (ForkNode *)0x0)) &&
           (NVar4 = Node::getType(&forkNode->super_Node), NVar4 == FORK)) {
          JoinNode::addCorrespondingFork(this_00,forkNode);
          local_7c = true;
        }
      }
      dg::ForkJoinAnalysis::joinFunctions((Value *)&local_70);
      pIVar1 = local_68;
      for (pIVar7 = local_70; pIVar7 != pIVar1; pIVar7 = pIVar7 + 8) {
        local_50 = *(key_type *)pIVar7;
        iVar6 = std::
                _Hashtable<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_FunctionGraph_*>,_std::allocator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Function_*>,_std::hash<const_llvm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->llvmToFunctionMap_)._M_h,&local_50);
        if ((iVar6.
             super__Node_iterator_base<std::pair<const_llvm::Function_*const,_FunctionGraph_*>,_false>
             ._M_cur != (__node_type *)0x0) &&
           (*(FunctionGraph **)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_llvm::Function_*const,_FunctionGraph_*>,_false>
                    ._M_cur + 0x10) != (FunctionGraph *)0x0)) {
          exitNode = FunctionGraph::exitNode
                               (*(FunctionGraph **)
                                 ((long)iVar6.
                                        super__Node_iterator_base<std::pair<const_llvm::Function_*const,_FunctionGraph_*>,_false>
                                        ._M_cur + 0x10));
          JoinNode::addJoinPredecessor(this_00,exitNode);
          local_7c = true;
        }
      }
      if (local_70 != (key_type)0x0) {
        operator_delete(local_70,local_60 - (long)local_70);
      }
      if (local_48 != (undefined8 *)0x0) {
        operator_delete(local_48,local_38 - (long)local_48);
      }
      local_58 = p_Var2->_M_nxt;
    } while (local_58 != (_Hash_node_base *)0x0);
  }
  return local_7c;
}

Assistant:

bool GraphBuilder::matchForksAndJoins() {
    using namespace llvm;
    bool changed = false;

    ForkJoinAnalysis FJA{pointsToAnalysis_};

    for (auto &it : llvmToJoins_) {
        // it.first -> llvm::CallInst, it.second -> RWNode *
        auto *joinNode = it.second;
        auto llvmforks = FJA.matchJoin(it.first);
        for (const auto *forkcall : llvmforks) {
            auto *foundInstruction =
                    findInstruction(cast<Instruction>(forkcall));
            auto *forkNode = castNode<NodeType::FORK>(foundInstruction);
            if (forkNode) {
                changed |= true;
                joinNode->addCorrespondingFork(forkNode);
            }
        }

        auto functions = FJA.joinFunctions(it.first);
        for (const auto *llvmFunction : functions) {
            auto *functionGraph = findFunction(cast<Function>(llvmFunction));
            if (functionGraph) {
                joinNode->addJoinPredecessor(functionGraph->exitNode());
                changed |= true;
            }
        }
    }

    return changed;
}